

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O0

void __thiscall
Inferences::AdditionGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *poly)

{
  undefined1 uVar1;
  bool bVar2;
  Elem self;
  SymbolId *pSVar3;
  SymbolId SVar4;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *in_RSI;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RDI;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> factor;
  StlIter __end0_1;
  StlIter __begin0_1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range5;
  MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> gen;
  SymbolId v;
  Option<Kernel::Variable> var;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  StlIter __end0;
  StlIter __begin0;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range3;
  Set<Kernel::Variable,_Lib::StlHash> didOccur;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffdc8;
  Set<Kernel::Variable,_Lib::StlHash> *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  SymbolId in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffe10;
  AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *in_stack_fffffffffffffe30;
  Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
  *in_stack_fffffffffffffe38;
  SymbolId in_stack_fffffffffffffe40;
  Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
  *in_stack_fffffffffffffe80;
  anon_class_8_1_ba1d4ab0 in_stack_fffffffffffffe88;
  anon_class_8_1_ba1d4ab0 in_stack_fffffffffffffe90;
  SymbolId in_stack_fffffffffffffe9c;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_150 [2];
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *in_stack_fffffffffffffed0;
  MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffee4;
  TermKind in_stack_fffffffffffffee8;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_110;
  uint local_fc;
  MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> local_f8;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  OptionBase<Kernel::Variable> local_c8 [5];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_a0 [4];
  undefined1 local_60 [32];
  undefined1 *local_40;
  
  Lib::Set<Kernel::Variable,_Lib::StlHash>::Set((Set<Kernel::Variable,_Lib::StlHash> *)0x73d256);
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>::
  operator->(in_RSI);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::iterSummands
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_stack_fffffffffffffdd0);
  local_40 = local_60;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           *)in_stack_fffffffffffffdc8);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
         *)in_stack_fffffffffffffdc8);
  do {
    uVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffdd0,
                            (StlIter *)in_stack_fffffffffffffdc8);
    if (!(bool)uVar1) {
      Lib::Set<Kernel::Variable,_Lib::StlHash>::~Set(in_stack_fffffffffffffdd0);
      return;
    }
    self = Lib::
           IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           ::StlIter::operator*((StlIter *)0x73d2e7);
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_stack_fffffffffffffde0,
               (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::tryVar(in_RDI);
    bVar2 = Lib::OptionBase<Kernel::Variable>::isSome(local_c8);
    if (bVar2) {
      pSVar3 = Lib::OptionBase<Kernel::Variable>::unwrap((OptionBase<Kernel::Variable> *)0x73d33c);
      local_cc = pSVar3->functor;
      bVar2 = Lib::Set<Kernel::Variable,_Lib::StlHash>::contains
                        ((Set<Kernel::Variable,_Lib::StlHash> *)
                         CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                         in_stack_fffffffffffffde0);
      if (bVar2) goto LAB_0073d4dd;
      pSVar3 = Lib::OptionBase<Kernel::Variable>::unwrap((OptionBase<Kernel::Variable> *)0x73d386);
      local_d4 = pSVar3->functor;
      local_d0 = local_d4;
      SVar4 = Lib::Set<Kernel::Variable,_Lib::StlHash>::insert
                        ((Set<Kernel::Variable,_Lib::StlHash> *)
                         CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                         in_stack_fffffffffffffde0);
      local_d8 = SVar4.functor;
      local_fc = local_d0;
      Lib::
      Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
      ::Perfect(&local_110,in_RSI);
      SVar4.kind = in_stack_fffffffffffffee8;
      SVar4.functor = in_stack_fffffffffffffee4;
      MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomSet
                (in_stack_fffffffffffffed8,SVar4,in_stack_fffffffffffffed0);
      in_stack_fffffffffffffed8 = &local_f8;
      in_stack_fffffffffffffee4 = (uint)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      Lib::
      Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
      ::operator()(in_stack_fffffffffffffe80,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe88);
      MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>::~MonomSet
                ((MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x73d467);
    }
    else {
LAB_0073d4dd:
      Lib::
      Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
      ::operator->(local_a0);
      Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::iter
                ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 in_stack_fffffffffffffdd0);
      in_stack_fffffffffffffed0 = local_150;
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
      ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
               *)in_stack_fffffffffffffdc8);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
      ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
             *)in_stack_fffffffffffffdc8);
      while (bVar2 = Lib::operator!=((StlIter *)in_stack_fffffffffffffdd0,
                                     (StlIter *)in_stack_fffffffffffffdc8), bVar2) {
        in_stack_fffffffffffffde0 =
             (SymbolId)
             Lib::
             IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
             ::StlIter::operator*((StlIter *)0x73d571);
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactor
                  ((MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                   in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        in_stack_fffffffffffffddf =
             Lib::
             Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ::is<Kernel::Variable>
                       ((Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                         *)0x73d599);
        if ((bool)in_stack_fffffffffffffddf) {
          in_stack_fffffffffffffdd0 =
               (Set<Kernel::Variable,_Lib::StlHash> *)
               Lib::
               Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ::unwrap<Kernel::Variable>
                         ((Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                           *)0x73d5b9);
          in_stack_fffffffffffffdc8 =
               *(MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                (in_RDI->numeral).super_RationalConstantType._num._val;
          MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>::bot();
          AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::AnyNumber
                    ((AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)
                     CONCAT17(uVar1,in_stack_fffffffffffffe10),
                     (MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *)self);
          Lib::
          Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
          ::replaceOrInsert(in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
                            in_stack_fffffffffffffe30);
          AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::~AnyNumber
                    ((AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)0x73d62f);
          MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>::~MonomSet
                    ((MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x73d639);
        }
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
        ::StlIter::operator++((StlIter *)in_stack_fffffffffffffdd0);
      }
    }
    Lib::Option<Kernel::Variable>::~Option((Option<Kernel::Variable> *)0x73d6a3);
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x73d6b0);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffdd0);
  } while( true );
}

Assistant:

void operator()(Perfect<Polynom<NumTraits>> poly)
  {
    // a variable might occur twice within one sum.
    Set<Variable, StlHash> didOccur;
    for (auto monom : poly->iterSummands()) {
      auto var = monom.tryVar();

      if (var.isSome() && !didOccur.contains(var.unwrap())) {
        auto v = var.unwrap();
        didOccur.insert(v);
        auto gen = MonomSet<NumTraits>(v, poly);
        map.updateOrInit(v,
            [&](AnyNumber<MonomSet> old_) 
            { 
              auto old = old_.downcast<NumTraits>().unwrap();
              auto result = std::move(old).intersect(std::move(gen));
              return AnyNumber<MonomSet>(std::move(result));
            },
            [&]() { return AnyNumber<MonomSet>(std::move(gen)); });
      } else {
        for (auto factor : monom.factors->iter()) {
           if (factor.term.template is<Variable>()) {
             auto v = factor.term.template unwrap<Variable>();
             map.replaceOrInsert(v, MonomSet<NumTraits>::bot());
           }
        }
      }

    }
  }